

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_namespace::postprocess(method_namespace *this,context_t *context,domain_type *domain)

{
  element_type *peVar1;
  var *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  allocator local_51;
  var local_50;
  undefined1 local_48 [16];
  string local_38;
  
  peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)(local_48 + 0x10),"__PRAGMA_CS_NAMESPACE_DEFINITION__",&local_51);
  this_00 = domain_type::get_var(domain,(string *)(local_48 + 0x10));
  name = cs_impl::any::const_val<std::__cxx11::string>(this_00);
  std::make_shared<cs::name_space,cs::domain_type_const&>((domain_type *)local_48);
  make_namespace((cs *)&local_50,(namespace_t *)local_48);
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (&(peVar1->super_runtime_type).storage,name,&local_50);
  cs_impl::any::recycle(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  return;
}

Assistant:

void method_namespace::postprocess(const context_t &context, const domain_type &domain)
	{
		context->instance->storage.add_var_no_return(domain.get_var("__PRAGMA_CS_NAMESPACE_DEFINITION__").const_val<string>(),
		        make_namespace(make_shared_namespace<name_space>(domain)));
	}